

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O2

Sequence * __thiscall ASDCP::MXF::Sequence::WriteToTLVSet(Sequence *this,TLVWriter *TLVSet)

{
  MDDEntry *Object;
  MDDEntry *in_RDX;
  TLVWriter local_80;
  
  if (TLVSet[1].super_MemIOWriter.m_p != (byte_t *)0x0) {
    StructuralComponent::WriteToTLVSet(&this->super_StructuralComponent,TLVSet);
    if (-1 < *(int *)&(this->super_StructuralComponent).super_InterchangeObject.super_KLVPacket.
                      _vptr_KLVPacket) {
      Object = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                MDD_Sequence_StructuralComponents);
      TLVWriter::WriteObject(&local_80,in_RDX,(IArchive *)Object);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
    }
    return this;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x427,"virtual ASDCP::Result_t ASDCP::MXF::Sequence::WriteToTLVSet(TLVWriter &)");
}

Assistant:

ASDCP::Result_t
Sequence::WriteToTLVSet(TLVWriter& TLVSet)
{
  assert(m_Dict);
  Result_t result = StructuralComponent::WriteToTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS(Sequence, StructuralComponents));
  return result;
}